

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::memLittle32_func(void *data,uint32 size)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  undefined4 *local_28;
  uint32 *words;
  uint8 *bytes;
  uint32 w;
  uint32 size_local;
  void *data_local;
  
  local_28 = (undefined4 *)data;
  words = (uint32 *)data;
  bytes._4_4_ = size >> 2;
  while (bytes._4_4_ != 0) {
    uVar1 = *local_28;
    *(char *)words = (char)uVar1;
    *(char *)((long)words + 1) = (char)((uint)uVar1 >> 8);
    puVar2 = (undefined1 *)((long)words + 3);
    *(char *)((long)words + 2) = (char)((uint)uVar1 >> 0x10);
    words = words + 1;
    *puVar2 = (char)((uint)uVar1 >> 0x18);
    local_28 = local_28 + 1;
    bytes._4_4_ = bytes._4_4_ - 1;
  }
  return;
}

Assistant:

void
memLittle32_func(void *data, uint32 size)
{
	uint32 w;
	uint8 *bytes = (uint8*)data;
	uint32 *words = (uint32*)data;
	size >>= 2;
	while(size--){
		w = *words++;
		*bytes++ = w;
		*bytes++ = w >> 8;
		*bytes++ = w >> 16;
		*bytes++ = w >> 24;
	}
}